

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

fixed_measurement units::root(fixed_measurement *fm,int power)

{
  fixed_measurement *in_RSI;
  unit in_RDI;
  unit *un;
  double extraout_XMM0_Qa;
  fixed_measurement fVar1;
  double in_stack_ffffffffffffffc8;
  unit local_1c;
  fixed_measurement *local_10;
  
  local_10 = in_RSI;
  fixed_measurement::value(in_RSI);
  un = (unit *)numericalRoot<double>(in_stack_ffffffffffffffc8,(int)in_RDI.base_units_);
  fixed_measurement::units(local_10);
  local_1c = root(un,(int)in_RDI.base_units_);
  fixed_measurement::fixed_measurement((fixed_measurement *)in_RDI,(double)un,&local_1c);
  fVar1.units_ = in_RDI;
  fVar1.value_ = extraout_XMM0_Qa;
  return fVar1;
}

Assistant:

fixed_measurement root(const fixed_measurement& fm, int power)
{
    return {numericalRoot(fm.value(), power), root(fm.units(), power)};
}